

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

uint32_t __thiscall cfd::core::AbstractTransaction::GetVsize(AbstractTransaction *this)

{
  CfdException *this_00;
  allocator local_45;
  int ret;
  size_t vsize;
  undefined1 local_38 [32];
  
  vsize = 0;
  ret = wally_tx_get_vsize((wally_tx *)this->wally_tx_pointer_,&vsize);
  if (ret == 0) {
    return (uint32_t)vsize;
  }
  local_38._0_8_ = "cfdcore_transaction_common.cpp";
  local_38._8_4_ = 0x248;
  local_38._16_8_ = "GetVsize";
  logger::warn<int&>((CfdSourceLocation *)local_38,"wally_tx_get_vsize NG[{}].",&ret);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_38,"transaction vsize calc error.",&local_45);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_38);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t AbstractTransaction::GetVsize() const {
  size_t vsize = 0;
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  int ret = wally_tx_get_vsize(tx_pointer, &vsize);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_vsize NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "transaction vsize calc error.");
  }
  return static_cast<uint32_t>(vsize);
}